

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzdohrstructmatrix.cpp
# Opt level: O1

int __thiscall
TPZDohrStructMatrix<double,_TPZStructMatrixOR<double>_>::ClusterIslands
          (TPZDohrStructMatrix<double,_TPZStructMatrixOR<double>_> *this,TPZVec<int> *domain_index,
          int nsub,int connectdimension)

{
  _Rb_tree_color _Var1;
  TPZCompEl *pTVar2;
  int *piVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  TPZCompEl **ppTVar7;
  mapped_type_conflict4 *pmVar8;
  TPZGeoEl *pTVar9;
  long lVar10;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar11;
  _Rb_tree_color *p_Var12;
  _Rb_tree_node_base *p_Var13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int64_t iVar17;
  _Self __tmp;
  int iVar18;
  int iVar19;
  int mydomainindex;
  int celdomain;
  TPZGeoElSide gelside;
  TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_> domain_neighbours;
  TPZManVector<int,_10> domain_dest;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> domain_index_count;
  key_type local_1ec;
  int local_1e8;
  int local_1e4;
  long local_1e0;
  undefined **local_1d8;
  undefined8 local_1d0;
  TPZGeoEl *local_1c8;
  TPZVec<int> *local_1c0;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  _func_int **local_1a8;
  undefined1 local_1a0 [8];
  _Rb_tree_node_base local_198;
  size_t local_178;
  TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_> local_170;
  long local_150;
  long local_148;
  TPZDohrStructMatrix<double,_TPZStructMatrixOR<double>_> *local_140;
  int64_t local_138;
  _func_int **local_130;
  _func_int **local_128;
  TPZStack<TPZCompElSide,_10> local_120;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  iVar19 = *(int *)(*(long *)&this->field_0x8 + 0x7e8);
  lVar10 = *(long *)(*(long *)&this->field_0x8 + 0x48);
  local_150 = (long)nsub;
  local_1e0 = SUB168(SEXT816(lVar10 / local_150) * SEXT816(0x6666666666666667),8);
  local_1e4 = nsub;
  local_1c0 = domain_index;
  local_140 = this;
  TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_>::TPZVec(&local_170,local_150);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148 = lVar10;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < lVar10) {
    iVar17 = 0;
    local_128 = (_func_int **)&PTR__TPZGeoElSide_01920090;
    local_1d8 = &PTR__TPZManVector_018424d8;
    local_130 = (_func_int **)&PTR__TPZManVector_01842198;
    local_1a8 = (_func_int **)&PTR__TPZVec_0183b970;
    local_1b4 = connectdimension;
    do {
      ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          ((TPZChunkVector<TPZCompEl_*,_10> *)
                           (*(long *)&local_140->field_0x8 + 0x40),iVar17);
      pTVar2 = *ppTVar7;
      if (pTVar2 != (TPZCompEl *)0x0) {
        local_1ec = local_1c0->fStore[pTVar2->fIndex];
        pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,&local_1ec);
        *pmVar8 = *pmVar8 + 1;
        local_138 = iVar17;
        pTVar9 = TPZCompEl::Reference(pTVar2);
        iVar17 = local_138;
        local_1c8 = pTVar9;
        if (pTVar9 != (TPZGeoEl *)0x0) {
          local_1d0 = (**(code **)(*(long *)pTVar9 + 0xf0))(pTVar9);
          local_1ac = (**(code **)(*(long *)pTVar9 + 0x210))(pTVar9);
          iVar17 = local_138;
          if (0 < (int)local_1d0) {
            local_1b0 = (int)local_1d0 + -1;
            iVar18 = 0;
            do {
              iVar5 = (**(code **)(*(long *)local_1c8 + 0x208))(local_1c8,iVar18);
              if ((local_1ac < connectdimension || iVar5 == connectdimension) &&
                 (local_1ac >= connectdimension || iVar18 == local_1b0)) {
                local_1a0 = (undefined1  [8])local_128;
                local_198._0_8_ = local_1c8;
                local_198._M_parent = (_Base_ptr)CONCAT44(local_198._M_parent._4_4_,iVar18);
                lVar10 = 0x28;
                do {
                  *(undefined8 *)((long)&local_128 + lVar10) = 0;
                  *(undefined4 *)
                   ((long)&(((TPZManVector<TPZCompElSide,_10> *)
                            (local_120.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + -2))->
                           super_TPZVec<TPZCompElSide>)._vptr_TPZVec + lVar10) = 0xffffffff;
                  lVar10 = lVar10 + 0x10;
                } while (lVar10 != 200);
                local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                fNElements = 0;
                local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc
                     = 0;
                local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                _vptr_TPZVec = local_130;
                local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
                     local_120.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc;
                TPZGeoElSide::ConnectedCompElementList((TPZGeoElSide *)local_1a0,&local_120,0,0);
                if (local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                    fNElements < 1) {
LAB_014e66ff:
                  local_1e8 = -1;
                  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::_M_insert_unique<int>(&local_170.fStore[local_1ec]._M_t,&local_1e8);
                }
                else {
                  lVar10 = 0;
                  lVar15 = 0;
                  iVar17 = local_120.super_TPZManVector<TPZCompElSide,_10>.
                           super_TPZVec<TPZCompElSide>.fNElements;
                  do {
                    pTVar2 = *(TPZCompEl **)
                              ((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                                       super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar10);
                    pTVar9 = TPZCompEl::Reference(pTVar2);
                    iVar5 = (**(code **)(*(long *)pTVar9 + 0x210))(pTVar9);
                    if (iVar5 == iVar19) {
                      local_1e8 = local_1c0->fStore[pTVar2->fIndex];
                      if (local_1e8 != local_1ec) {
                        std::
                        _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                        _M_insert_unique<int_const&>
                                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                    *)(local_170.fStore + local_1ec),&local_1e8);
                      }
                      lVar15 = lVar15 + 1;
                    }
                    lVar10 = lVar10 + 0x10;
                    iVar17 = iVar17 + -1;
                  } while (iVar17 != 0);
                  connectdimension = local_1b4;
                  if (lVar15 == 0) goto LAB_014e66ff;
                }
                if (local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                    fStore == local_120.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc) {
                  local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore
                       = (TPZCompElSide *)0x0;
                }
                local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc
                     = 0;
                local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                _vptr_TPZVec = local_1a8;
                if (local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                    fStore != (TPZCompElSide *)0x0) {
                  operator_delete__(local_120.super_TPZManVector<TPZCompElSide,_10>.
                                    super_TPZVec<TPZCompElSide>.fStore);
                }
              }
              iVar18 = iVar18 + 1;
              iVar17 = local_138;
            } while (iVar18 != (int)local_1d0);
          }
        }
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 != local_148);
  }
  local_1a0._0_4_ = 0xffffffff;
  TPZManVector<int,_10>::TPZManVector
            ((TPZManVector<int,_10> *)&local_120,local_150,(int *)local_1a0);
  local_1ec = 0;
  if (local_1e4 < 1) {
    iVar19 = 0;
  }
  else {
    lVar10 = (local_1e0 >> 3) - (local_1e0 >> 0x3f);
    iVar19 = 0;
    iVar18 = local_1e4;
    local_1e0 = lVar10;
    do {
      lVar15 = (long)local_1ec;
      if (local_170.fStore[lVar15]._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
        lVar14 = (long)(int)local_170.fStore[lVar15]._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_left[1]._M_color;
        if (lVar14 != -1) {
          iVar5 = *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                                   super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar14 * 4);
          if (iVar5 == -1) {
            if (*(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                                 super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar15 * 4) == -1) {
              *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                               super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar15 * 4) = iVar19;
              *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                               super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar14 * 4) = iVar19;
              iVar19 = iVar19 + 1;
            }
            else {
              *(undefined4 *)
               ((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                       fStore)->fEl + lVar14 * 4) =
                   *(undefined4 *)
                    ((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                             super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar15 * 4);
            }
          }
          else {
            *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                             super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar15 * 4) = iVar5;
          }
        }
      }
      else if ((*(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                                 super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar15 * 4) == -1) &&
              (pmVar8 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&local_60,&local_1ec), *pmVar8 < lVar10)) {
        local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
        local_198._M_parent = (_Base_ptr)0x0;
        local_198._M_left = &local_198;
        local_178 = 0;
        psVar11 = local_170.fStore + local_1ec;
        p_Var13 = (psVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        local_198._M_right = local_198._M_left;
        while ((_Rb_tree_header *)p_Var13 != &(psVar11->_M_t)._M_impl.super__Rb_tree_header) {
          _Var1 = p_Var13[1]._M_color;
          if (_Var1 != ~_S_red) {
            pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)&local_60,&local_1ec);
            p_Var12 = (_Rb_tree_color *)
                      std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_1a0,pmVar8);
            *p_Var12 = _Var1;
          }
          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
          psVar11 = local_170.fStore + local_1ec;
        }
        lVar10 = std::_Rb_tree_decrement(&local_198);
        local_1e8 = *(int *)(lVar10 + 0x24);
        pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,&local_1e8);
        iVar18 = *pmVar8;
        pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,&local_1ec);
        iVar5 = *pmVar8;
        pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,&local_1e8);
        *pmVar8 = iVar5 + iVar18;
        pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,&local_1ec);
        lVar10 = local_1e0;
        iVar18 = local_1e4;
        *pmVar8 = 0;
        iVar5 = *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                                 super_TPZVec<TPZCompElSide>.fStore)->fEl + (long)local_1e8 * 4);
        if (iVar5 == -1) {
          *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                           super_TPZVec<TPZCompElSide>.fStore)->fEl + (long)local_1e8 * 4) = iVar19;
          *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                           super_TPZVec<TPZCompElSide>.fStore)->fEl + (long)local_1ec * 4) = iVar19;
          iVar19 = iVar19 + 1;
        }
        else {
          *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                           super_TPZVec<TPZCompElSide>.fStore)->fEl + (long)local_1ec * 4) = iVar5;
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)local_1a0);
      }
      else if (*(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                                super_TPZVec<TPZCompElSide>.fStore)->fEl + (long)local_1ec * 4) ==
               -1) {
        *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>
                        .fStore)->fEl + (long)local_1ec * 4) = iVar19;
        iVar19 = iVar19 + 1;
      }
      local_1ec = local_1ec + 1;
    } while (local_1ec < iVar18);
  }
  uVar6 = (uint)local_1c0->fNElements;
  if (0 < (int)uVar6) {
    piVar3 = local_1c0->fStore;
    uVar16 = 0;
    do {
      piVar3[uVar16] =
           *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                            super_TPZVec<TPZCompElSide>.fStore)->fEl + (long)piVar3[uVar16] * 4);
      uVar16 = uVar16 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar16);
  }
  TPZManVector<int,_10>::~TPZManVector((TPZManVector<int,_10> *)&local_120);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  local_170._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01a15510;
  if (local_170.fStore != (set<int,_std::less<int>,_std::allocator<int>_> *)0x0) {
    sVar4 = local_170.fStore[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (sVar4 != 0) {
      lVar10 = sVar4 * 0x30;
      do {
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  (&local_170.fStore[-1]._M_t._M_impl.field_0x0 + lVar10));
        lVar10 = lVar10 + -0x30;
      } while (lVar10 != 0);
    }
    operator_delete__(&local_170.fStore[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      sVar4 * 0x30 + 8);
  }
  return iVar19;
}

Assistant:

int  TPZDohrStructMatrix<TVar,TPar>::ClusterIslands(TPZVec<int> &domain_index,int nsub,int connectdimension)
{
    int meshdim = this->fMesh->Dimension();
    int64_t nel = this->fMesh->NElements();
    int64_t mincount = nel/nsub/20;
    // contains for each subdomain the set of neighbouring domains
    TPZVec<std::set<int> > domain_neighbours(nsub);
    // contains for each domain the number of cells within that domain
    std::map<int,int> domain_index_count;
    int64_t iel;
    for (iel=0; iel<nel; iel++) {
        TPZCompEl *cel = this->fMesh->ElementVec()[iel];
        if (!cel) {
            continue;
        }
        int mydomainindex = domain_index[cel->Index()];
        //        if (mydomainindex == 0) {
        //            std::stringstream sout;
        //            cel->Print(sout);
        //            TPZGeoEl *gel = cel->Reference();
        //            if (gel) {
        //                gel->Print(sout);
        //            }
        //            LOGPZ_DEBUG(logger, sout.str())
        //        }
        domain_index_count[mydomainindex]++;
        TPZGeoEl *gel = cel->Reference();
        if (!gel) {
            continue;
        }
        int nsides = gel->NSides();
        int geldim = gel->Dimension();
        int is;
        for (is=0; is<nsides; is++) {
            int sidedim = gel->SideDimension(is);
            if (sidedim != connectdimension && geldim>=connectdimension) {
                continue;
            }
            if (geldim < connectdimension && is != nsides-1)
            {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZStack<TPZCompElSide> elsidevec;
            gelside.ConnectedCompElementList(elsidevec, 0, 0);
            int64_t nneigh = elsidevec.NElements();
            int64_t neigh;
            int64_t nneighvalid = 0;
            for (neigh = 0; neigh <nneigh; neigh++) {
                TPZCompElSide celside = elsidevec[neigh];
                TPZCompEl *celloc = celside.Element();
                TPZGeoEl *gelloc = celloc->Reference();
                if (gelloc->Dimension() != meshdim) {
                    continue;
                }
                nneighvalid++;
                int celdomain = domain_index[celloc->Index()];
                if (celdomain != mydomainindex)
                {
                    domain_neighbours[mydomainindex].insert(celdomain);
                }
            }
            if (nneighvalid == 0)
            {
                // include the boundary as a ficticious neighbour index
                domain_neighbours[mydomainindex].insert(-1);
            }
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        for (int64_t i=0; i<domain_neighbours.size(); i++) {
            std::set<int>::const_iterator it;
            sout << "Domain index " << i << " neighbours ";
            for (it=domain_neighbours[i].begin(); it != domain_neighbours[i].end(); it++) {
                sout << *it << " ";
            }
            sout << std::endl;
        }
        std::map<int,int>::const_iterator it = domain_index_count.begin();
        while (it != domain_index_count.end()) {
            sout << "Domain index " << it->first << " number of elements " << it->second << std::endl;
            it++;
        }
        LOGPZ_DEBUG(logger, sout.str())
        
    }
#endif
    // compute a destination domain index for each domain (used for clustering domains)
    int isub;
    TPZManVector<int> domain_dest(nsub,-1);
    int64_t count = 0;
    for (isub=0; isub < nsub; isub++)
    {
        // if the subdomain is neighbour to only one subdomain
        // this means that the subdomain is isolated (only boundaries as neighbours) (not treated)
        // or that the domain is embedded in another domain
        if (domain_neighbours[isub].size() == 1 )
        {
            // merge both subdomains
            int target = *(domain_neighbours[isub].begin());
            // target == -1 is not treated here
            if (target == -1) {
                continue;
            }
            if (domain_dest[target] == -1 && domain_dest[isub] == -1)
            {
                domain_dest[isub] = count;
                domain_dest[target] = count;
                count++;
            }
            else if (domain_dest[target] == -1)
            {
                domain_dest[target] = domain_dest[isub];
            }
            else
            {
                domain_dest[isub] = domain_dest[target];
            }
            
        }
        else if(domain_dest[isub] == -1 && domain_index_count[isub] < mincount)
        {
            // the domain has very little elements
            // the domain has at least two neighbouring domains (may include the ficticious -1 domain)
            std::map<int,int> sizeDomain;
            std::set<int>::iterator it;
            for (it = domain_neighbours[isub].begin(); it != domain_neighbours[isub].end(); it++) {
                if (*it != -1) {
                    sizeDomain[domain_index_count[isub]] = *it;
                }
            }
            int domaintargetindex = sizeDomain.rbegin()->second;
            int destdomainindexcount = domain_index_count[domaintargetindex];
            int domainshrinkcount = domain_index_count[isub];
            domain_index_count[domaintargetindex] = destdomainindexcount+domainshrinkcount;
            domain_index_count[isub] = 0;
            if(domain_dest[domaintargetindex] == -1)
            {
                domain_dest[domaintargetindex] = count;
                domain_dest[isub] = count;
                count++;
            }
            else {
                domain_dest[isub] = domain_dest[domaintargetindex];
            }
            
        }
        else if (domain_dest[isub] == -1)
        {
            domain_dest[isub] = count++;
        }
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        int isub;
        for (isub=0; isub < nsub; isub++) {
            sout << "isub = " << isub << " number of neighbours " << domain_neighbours[isub].size() << " domains ";
            std::set<int>::iterator it;
            for (it = domain_neighbours[isub].begin(); it != domain_neighbours[isub].end(); it++) {
                sout << *it << " ";
            }
            sout << std::endl;
        }
        sout << "Destination domain " << domain_dest << std::endl;
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    int domsize = domain_index.NElements();
    int d;
    for (d=0; d<domsize; d++) {
        domain_index[d] = domain_dest[domain_index[d]];
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "Number of elements per domain ";
        std::map<int,int>::iterator it;
        int64_t count = 0;
        for (it=domain_index_count.begin(); it != domain_index_count.end(); it++) {
            if (! (count++ %40)) {
                sout << std::endl;
            }
            sout << it->first << " " << it->second << " ";
        }
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    
    return count;
}